

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadLayerFromFile
               (string *_filename,Layer *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  uchar *addr;
  size_type length;
  size_t max_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string base_dir;
  undefined1 local_1f0 [8];
  string filepath;
  string local_1d0 [32];
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  USDLoadOptions *options_local;
  string *err_local;
  string *warn_local;
  Layer *stage_local;
  string *_filename_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    io::ExpandFilePath((string *)local_1f0,(string *)_filename,(void *)0x0);
    io::GetBaseDir((string *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(string *)_filename);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes,
                              (string *)err,(string *)local_1f0,
                              (long)options->max_memory_limit_in_mb << 0x14,(void *)0x0);
    if (bVar1) {
      addr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
      length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
      _filename_local._7_1_ =
           LoadLayerFromMemory(addr,length,(string *)local_1f0,stage,warn,err,options);
    }
    else {
      _filename_local._7_1_ = false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&max_bytes);
    ::std::__cxx11::string::~string
              ((string *)
               &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string((string *)local_1f0);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar3 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tinyusdz.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"LoadLayerFromFile");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x53d);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1b0,"Input filename is empty.");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1d0);
      ::std::__cxx11::string::~string(local_1d0);
    }
    _filename_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return _filename_local._7_1_;
}

Assistant:

bool LoadLayerFromFile(const std::string &_filename, Layer *stage,
                     std::string *warn, std::string *err,
                     const USDLoadOptions &options) {

  if (_filename.empty()) {
    PUSH_ERROR_AND_RETURN("Input filename is empty.");
  }

  // TODO: Use AssetResolutionResolver.
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);
  std::string base_dir = io::GetBaseDir(_filename);

  std::vector<uint8_t> data;
  size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
  if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                         /* userdata */ nullptr)) {
    return false;
  }

  return LoadLayerFromMemory(data.data(), data.size(), filepath, stage, warn, err,
                           options);
}